

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void SetClipboardTextFn_DefaultImpl(void *param_1,char *text)

{
  ImVector<char> *this;
  ImGuiContext *pIVar1;
  size_t __n;
  
  pIVar1 = GImGui;
  this = &GImGui->PrivateClipboard;
  ImVector<char>::clear(this);
  __n = strlen(text);
  ImVector<char>::resize(this,(int)__n + 1);
  memcpy((pIVar1->PrivateClipboard).Data,text,__n);
  (pIVar1->PrivateClipboard).Data[(int)__n] = '\0';
  return;
}

Assistant:

static void SetClipboardTextFn_DefaultImpl(void*, const char* text)
{
    ImGuiContext& g = *GImGui;
    g.PrivateClipboard.clear();
    const char* text_end = text + strlen(text);
    g.PrivateClipboard.resize((int)(text_end - text) + 1);
    memcpy(&g.PrivateClipboard[0], text, (size_t)(text_end - text));
    g.PrivateClipboard[(int)(text_end - text)] = 0;
}